

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

void __thiscall kratos::Var::set_size_param(Var *this,uint32_t index,Var *param)

{
  pointer psVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  _Head_base<2UL,_kratos::Var_*,_false> root;
  long lVar4;
  int iVar5;
  uint64_t uVar6;
  mapped_type *ppVVar7;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var8;
  VarException *this_00;
  UserException *pUVar9;
  ulong uVar10;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  __node_base_ptr p_Var11;
  __node_base_ptr p_Var12;
  pointer psVar13;
  long *plVar14;
  pair<std::_Rb_tree_iterator<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>,_std::_Rb_tree_iterator<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>_>
  pVar15;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  initializer_list<const_kratos::IRNode_*> __l;
  element_type *local_138;
  Var *local_130;
  undefined1 auStack_128 [8];
  ParamVisitor visitor;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  slice_index;
  _Head_base<2UL,_kratos::Var_*,_false> local_88;
  __buckets_ptr pp_Stack_80;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_60;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  allocator_type local_35;
  uint32_t local_34 [2];
  uint32_t index_local;
  
  local_34[0] = index;
  if ((this->type_ & ~PortIO) != Base) {
    pUVar9 = (UserException *)__cxa_allocate_exception(0x10);
    (*(this->super_IRNode)._vptr_IRNode[0x1f])(local_58,this);
    local_88._M_head_impl = (Var *)local_58._0_8_;
    format_str_01.size_ = 0xd;
    format_str_01.data_ = (char *)0x1d;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_01.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_88;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)auStack_128,(detail *)"{0} is not a variable or port",format_str_01,args_01
              );
    UserException::UserException(pUVar9,(string *)auStack_128);
    __cxa_throw(pUVar9,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((ulong)((long)(this->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 2) <= (ulong)index) {
    pUVar9 = (UserException *)__cxa_allocate_exception(0x10);
    (*(this->super_IRNode)._vptr_IRNode[0x1f])(&local_88,this);
    visitor.super_IRVisitor._8_8_ = ZEXT48(local_34[0]);
    auStack_128 = (undefined1  [8])local_88._M_head_impl;
    visitor.super_IRVisitor._vptr_IRVisitor = (_func_int **)pp_Stack_80;
    format_str_00.size_ = 0x2d;
    format_str_00.data_ = (char *)0x1f;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_128;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)local_58,(detail *)"{0} does not have {1} dimension",format_str_00,args_00)
    ;
    UserException::UserException(pUVar9,(string *)local_58);
    __cxa_throw(pUVar9,&UserException::typeinfo,std::runtime_error::~runtime_error);
  }
  if (param == (Var *)0x0) {
    uVar2 = (this->size_param_)._M_h._M_bucket_count;
    uVar10 = (ulong)index % uVar2;
    p_Var11 = (this->size_param_)._M_h._M_buckets[uVar10];
    p_Var12 = (__node_base_ptr)0x0;
    if ((p_Var11 != (__node_base_ptr)0x0) &&
       (p_Var3 = p_Var11->_M_nxt, p_Var12 = p_Var11,
       *(uint32_t *)&p_Var11->_M_nxt[1]._M_nxt != index)) {
      while (p_Var11 = p_Var3, p_Var3 = p_Var11->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
        p_Var12 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var3[1]._M_nxt % uVar2 != uVar10) ||
           (p_Var12 = p_Var11, *(uint *)&p_Var3[1]._M_nxt == index)) goto LAB_001a3228;
      }
      p_Var12 = (__node_base_ptr)0x0;
    }
LAB_001a3228:
    if (p_Var12 == (__node_base_ptr)0x0) {
      return;
    }
    if (p_Var12->_M_nxt == (_Hash_node_base *)0x0) {
      return;
    }
    local_60 = &(this->size_param_)._M_h;
    ppVVar7 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)local_60,local_34);
    root._M_head_impl = *ppVVar7;
    visitor.super_IRVisitor._8_8_ =
         &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
    visitor.super_IRVisitor._vptr_IRVisitor =
         (_func_int **)((ulong)visitor.super_IRVisitor._vptr_IRVisitor._4_4_ << 0x20);
    visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
    visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
    visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
    auStack_128 = (undefined1  [8])&PTR_visit_root_002d7260;
    visitor.super_IRVisitor.visited_._M_h._M_single_bucket =
         (__node_base_ptr)&visitor.params_._M_h._M_rehash_policy._M_next_resize;
    visitor.params_._M_h._M_buckets = (__buckets_ptr)0x1;
    visitor.params_._M_h._M_bucket_count = 0;
    visitor.params_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    visitor.params_._M_h._M_element_count._0_4_ = 0x3f800000;
    visitor.params_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    visitor.params_._M_h._M_rehash_policy._4_4_ = 0;
    visitor.params_._M_h._M_rehash_policy._M_next_resize = 0;
    IRVisitor::visit_root((IRVisitor *)auStack_128,&(root._M_head_impl)->super_IRNode);
    if (visitor.params_._M_h._M_bucket_count != 0) {
      plVar14 = (long *)visitor.params_._M_h._M_bucket_count;
      do {
        lVar4 = plVar14[1];
        local_58._8_4_ = local_34[0];
        local_58._0_8_ = root._M_head_impl;
        local_48._M_allocated_capacity = (size_type)this;
        pVar15 = std::
                 _Rb_tree<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>,_std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>,_std::_Identity<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>,_std::less<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>,_std::allocator<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>_>
                 ::equal_range((_Rb_tree<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>,_std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>,_std::_Identity<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>,_std::less<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>,_std::allocator<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>_>
                                *)(lVar4 + 0x300),(key_type *)local_58);
        std::
        _Rb_tree<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>,_std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>,_std::_Identity<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>,_std::less<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>,_std::allocator<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>_>
        ::_M_erase_aux((_Rb_tree<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>,_std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>,_std::_Identity<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>,_std::less<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>,_std::allocator<std::tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*>_>_>
                        *)(lVar4 + 0x300),(_Base_ptr)pVar15.first._M_node,
                       (_Base_ptr)pVar15.second._M_node);
        plVar14 = (long *)*plVar14;
      } while (plVar14 != (long *)0x0);
    }
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase(local_60,local_34);
    p_Var8 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)&PTR_visit_root_002d7260;
  }
  else {
    uVar6 = Simulator::static_evaluate_expr(param);
    psVar1 = (this->slices_).
             super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar13 = (this->slices_).
                   super__Vector_base<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar13 != psVar1;
        psVar13 = psVar13 + 1) {
      iVar5 = (*(((psVar13->super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 )->super_Var).super_IRNode._vptr_IRNode[0x2b])();
      if ((char)iVar5 == '\0') {
        (*(((psVar13->super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          super_Var).super_IRNode._vptr_IRNode[0x24])(&visitor.params_._M_h._M_single_bucket);
        if (((ulong)local_34[0] <
             (ulong)((long)slice_index.
                           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start -
                     (long)visitor.params_._M_h._M_single_bucket >> 3)) &&
           ((uVar6 <= ((ulong)visitor.params_._M_h._M_single_bucket[local_34[0]]._M_nxt & 0xffffffff
                      ) ||
            (uVar6 <= (ulong)visitor.params_._M_h._M_single_bucket[local_34[0]]._M_nxt >> 0x20)))) {
          this_00 = (VarException *)__cxa_allocate_exception(0x10);
          (*(((psVar13->super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_88);
          auStack_128 = (undefined1  [8])(ulong)local_34[0];
          visitor.super_IRVisitor._8_8_ = local_88._M_head_impl;
          visitor.super_IRVisitor.visited_._M_h._M_buckets = pp_Stack_80;
          format_str.size_ = 0xd2;
          format_str.data_ = (char *)0x32;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.args_ = in_R9.args_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)auStack_128;
          fmt::v7::detail::vformat_abi_cxx11_
                    ((string *)local_58,
                     (detail *)"Unable to parameterize dim {0} due to usage of {1}",format_str,args)
          ;
          local_138 = (psVar13->super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr;
          __l._M_len = 2;
          __l._M_array = (iterator)&local_138;
          local_130 = this;
          std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                    ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                     auStack_128,__l,&local_35);
          VarException::VarException
                    (this_00,(string *)local_58,
                     (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)
                     auStack_128);
          __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
        }
        if (visitor.params_._M_h._M_single_bucket != (__node_base_ptr)0x0) {
          operator_delete(visitor.params_._M_h._M_single_bucket,
                          (long)slice_index.
                                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)visitor.params_._M_h._M_single_bucket);
        }
      }
    }
    (this->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[local_34[0]] = (uint)uVar6;
    ppVVar7 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->size_param_,local_34);
    *ppVVar7 = param;
    visitor.super_IRVisitor._8_8_ =
         &visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize;
    visitor.super_IRVisitor._vptr_IRVisitor =
         (_func_int **)((ulong)visitor.super_IRVisitor._vptr_IRVisitor._4_4_ << 0x20);
    visitor.super_IRVisitor.visited_._M_h._M_buckets = (__buckets_ptr)0x1;
    visitor.super_IRVisitor.visited_._M_h._M_bucket_count = 0;
    visitor.super_IRVisitor.visited_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    visitor.super_IRVisitor.visited_._M_h._M_element_count._0_4_ = 0x3f800000;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._4_4_ = 0;
    visitor.super_IRVisitor.visited_._M_h._M_rehash_policy._M_next_resize = 0;
    local_60 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_kratos::Var_*>,_std::allocator<std::pair<const_unsigned_int,_kratos::Var_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)&PTR_visit_root_002d7260;
    auStack_128 = (undefined1  [8])&PTR_visit_root_002d7260;
    visitor.super_IRVisitor.visited_._M_h._M_single_bucket =
         (__node_base_ptr)&visitor.params_._M_h._M_rehash_policy._M_next_resize;
    visitor.params_._M_h._M_buckets = (__buckets_ptr)0x1;
    visitor.params_._M_h._M_bucket_count = 0;
    visitor.params_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    visitor.params_._M_h._M_element_count._0_4_ = 0x3f800000;
    visitor.params_._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    visitor.params_._M_h._M_rehash_policy._4_4_ = 0;
    visitor.params_._M_h._M_rehash_policy._M_next_resize = 0;
    IRVisitor::visit_root((IRVisitor *)auStack_128,&param->super_IRNode);
    p_Var8 = local_60;
    if (visitor.params_._M_h._M_bucket_count != 0) {
      plVar14 = (long *)visitor.params_._M_h._M_bucket_count;
      do {
        local_58._8_4_ = local_34[0];
        local_58._0_8_ = param;
        local_48._M_allocated_capacity = (size_type)this;
        std::
        _Rb_tree<std::tuple<kratos::Var*,unsigned_int,kratos::Var*>,std::tuple<kratos::Var*,unsigned_int,kratos::Var*>,std::_Identity<std::tuple<kratos::Var*,unsigned_int,kratos::Var*>>,std::less<std::tuple<kratos::Var*,unsigned_int,kratos::Var*>>,std::allocator<std::tuple<kratos::Var*,unsigned_int,kratos::Var*>>>
        ::_M_emplace_unique<std::tuple<kratos::Var*,unsigned_int,kratos::Var*>>
                  ((_Rb_tree<std::tuple<kratos::Var*,unsigned_int,kratos::Var*>,std::tuple<kratos::Var*,unsigned_int,kratos::Var*>,std::_Identity<std::tuple<kratos::Var*,unsigned_int,kratos::Var*>>,std::less<std::tuple<kratos::Var*,unsigned_int,kratos::Var*>>,std::allocator<std::tuple<kratos::Var*,unsigned_int,kratos::Var*>>>
                    *)(plVar14[1] + 0x300),
                   (tuple<kratos::Var_*,_unsigned_int,_kratos::Var_*> *)local_58);
        plVar14 = (long *)*plVar14;
        p_Var8 = local_60;
      } while (plVar14 != (long *)0x0);
    }
  }
  auStack_128 = (undefined1  [8])p_Var8;
  std::
  _Hashtable<kratos::Param_*,_kratos::Param_*,_std::allocator<kratos::Param_*>,_std::__detail::_Identity,_std::equal_to<kratos::Param_*>,_std::hash<kratos::Param_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::Param_*,_kratos::Param_*,_std::allocator<kratos::Param_*>,_std::__detail::_Identity,_std::equal_to<kratos::Param_*>,_std::hash<kratos::Param_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  auStack_128 = (undefined1  [8])&PTR_visit_root_002d9288;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&visitor.super_IRVisitor.level);
  return;
}

Assistant:

void Var::set_size_param(uint32_t index, Var *param) {
    if (type_ != VarType::Base && type_ != VarType::PortIO)
        throw UserException(::format("{0} is not a variable or port", to_string()));
    if (index >= size_.size())
        throw UserException(::format("{0} does not have {1} dimension", to_string(), index));

    if (param == nullptr) {
        if (size_param_.find(index) != size_param_.end()) {
            auto *linked_param = size_param_.at(index);
            // get all the parameters
            ParamVisitor visitor;
            visitor.visit_root(linked_param);
            auto const &params = visitor.params();
            for (const auto &p : params) {
                p->remove_param_size_var(this, index, linked_param);
            }
            size_param_.erase(index);
        }
        return;
    }

    auto new_dim_size = Simulator::static_evaluate_expr(param);

    // LCOV_EXCL_STOP
    for (auto const &slice : slices_) {
        if (!slice->sliced_by_var()) {
            auto slice_index = slice->get_slice_index();
            if (slice_index.size() > index) {
                auto [high, low] = slice_index[index];
                if (high >= new_dim_size || low >= new_dim_size)
                    throw VarException(
                        ::format("Unable to parameterize dim {0} due to usage of {1}", index,
                                 slice->to_string()),
                        {slice.get(), this});
            }
        }
    }
    // all good. now we need to resize the index
    size_[index] = new_dim_size;
    size_param_[index] = param;

    // get all the parameters
    ParamVisitor visitor;
    visitor.visit_root(param);
    auto const &params = visitor.params();
    for (const auto &p : params) {
        p->add_param_size_var(this, index, param);
    }
}